

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HitQueue.h
# Opt level: O3

void __thiscall HitQueue::NextTimeFrame(HitQueue *this)

{
  pointer piVar1;
  int iVar2;
  
  piVar1 = (this->hitsPerTimeFrame_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)this->windowBegin_ <
      (ulong)((long)(this->hitsPerTimeFrame_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
    this->activeHitsSum_ = this->activeHitsSum_ - piVar1[this->windowBegin_];
    MoveNext(this);
    iVar2 = sumOfRange(this,this->windowBegin_,this->windowEnd_);
    if (iVar2 == this->activeHitsSum_) {
      return;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  __assert_fail("sumOfRange(windowBegin_, windowEnd_) == activeHitsSum_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/HitQueue.h"
                ,0x1a,"void HitQueue::NextTimeFrame()");
}

Assistant:

void NextTimeFrame()
    {
        activeHitsSum_ -= hitsPerTimeFrame_.at(windowBegin_);
        MoveNext();

        CONTRACT_EXPECT(sumOfRange(windowBegin_, windowEnd_) == activeHitsSum_);
    }